

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::is_physical_pointer_to_buffer_block(Compiler *this,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  bool local_35;
  bool local_21;
  SPIRType *type_local;
  Compiler *this_local;
  
  bVar1 = is_physical_pointer(this,type);
  local_21 = false;
  if (bVar1) {
    pSVar4 = get_pointee_type(this,type);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar4->super_IVariant).self);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    local_21 = false;
    if (uVar2 == uVar3) {
      bVar1 = has_decoration(this,(ID)(type->super_IVariant).self.id,Block);
      local_35 = true;
      if (!bVar1) {
        local_35 = has_decoration(this,(ID)(type->super_IVariant).self.id,BufferBlock);
      }
      local_21 = local_35;
    }
  }
  return local_21;
}

Assistant:

bool Compiler::is_physical_pointer_to_buffer_block(const SPIRType &type) const
{
	return is_physical_pointer(type) && get_pointee_type(type).self == type.parent_type &&
	       (has_decoration(type.self, DecorationBlock) ||
	        has_decoration(type.self, DecorationBufferBlock));
}